

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void RPCRunLater(string *name,function<void_()> *func,int64_t nSeconds)

{
  string_view source_file;
  undefined1 uVar1;
  int iVar2;
  undefined8 uVar3;
  undefined4 extraout_var;
  pointer in_RDX;
  undefined8 in_RSI;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<RPCTimerBase,_std::default_delete<RPCTimerBase>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<RPCTimerBase,_std::default_delete<RPCTimerBase>_>_>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<RPCTimerBase,_std::default_delete<RPCTimerBase>_>_>_>,_bool>
  pVar4;
  Level in_stack_00000070;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000080;
  long *in_stack_00000088;
  char **in_stack_00000090;
  UniqueLock<GlobalMutex> criticalblock17;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  key_type *in_stack_fffffffffffffed0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<RPCTimerBase,_std::default_delete<RPCTimerBase>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<RPCTimerBase,_std::default_delete<RPCTimerBase>_>_>_>_>
  *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  string *in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  int source_line;
  ConstevalFormatString<3U> in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff88;
  string_view in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [2];
  long local_8;
  
  source_line = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (timerInterface == (RPCTimerInterface *)0x0) {
    uVar3 = __cxa_allocate_exception(0x58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
               (allocator<char> *)in_stack_ffffffffffffff08);
    JSONRPCError((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),in_stack_ffffffffffffff08);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(uVar3,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else {
    local_50[0]._M_dataplus._M_p = in_RDX;
    MaybeCheckNotHeld<GlobalMutex>
              ((GlobalMutex *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    UniqueLock<GlobalMutex>::UniqueLock
              ((UniqueLock<GlobalMutex> *)in_stack_ffffffffffffff08,
               (GlobalMutex *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
               (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffee8 >> 0x18,0));
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<RPCTimerBase,_std::default_delete<RPCTimerBase>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<RPCTimerBase,_std::default_delete<RPCTimerBase>_>_>_>_>
    ::erase(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    uVar1 = LogAcceptCategory(CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),Trace);
    if ((bool)uVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0);
      iVar2 = (*timerInterface->_vptr_RPCTimerInterface[2])();
      source_file._M_len._4_4_ = extraout_var;
      source_file._M_len._0_4_ = iVar2;
      in_stack_fffffffffffffee8 =
           (basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffff80;
      in_stack_fffffffffffffee0 = local_50;
      in_stack_fffffffffffffec8 = 1;
      source_file._M_str = in_stack_ffffffffffffff88;
      LogPrintFormatInternal<std::__cxx11::string,long,char_const*>
                (in_stack_ffffffffffffff90,source_file,source_line,
                 CONCAT17(uVar1,in_stack_ffffffffffffff30),in_stack_00000070,
                 in_stack_ffffffffffffff78,in_stack_00000080,in_stack_00000088,in_stack_00000090);
      in_stack_fffffffffffffed8 = in_RDI;
    }
    (*timerInterface->_vptr_RPCTimerInterface[3])
              (timerInterface,in_RSI,(long)local_50[0]._M_dataplus._M_p * 1000);
    std::unique_ptr<RPCTimerBase,std::default_delete<RPCTimerBase>>::
    unique_ptr<std::default_delete<RPCTimerBase>,void>
              ((unique_ptr<RPCTimerBase,_std::default_delete<RPCTimerBase>_> *)
               CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),(pointer)0x7191c0);
    pVar4 = std::
            map<std::__cxx11::string,std::unique_ptr<RPCTimerBase,std::default_delete<RPCTimerBase>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<RPCTimerBase,std::default_delete<RPCTimerBase>>>>>
            ::
            emplace<std::__cxx11::string_const&,std::unique_ptr<RPCTimerBase,std::default_delete<RPCTimerBase>>>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<RPCTimerBase,_std::default_delete<RPCTimerBase>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<RPCTimerBase,_std::default_delete<RPCTimerBase>_>_>_>_>
                        *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                       (unique_ptr<RPCTimerBase,_std::default_delete<RPCTimerBase>_> *)
                       in_stack_fffffffffffffed8);
    local_50[0]._M_string_length = (size_type)pVar4.first._M_node;
    local_50[0].field_2._0_1_ = pVar4.second;
    std::unique_ptr<RPCTimerBase,_std::default_delete<RPCTimerBase>_>::~unique_ptr
              ((unique_ptr<RPCTimerBase,_std::default_delete<RPCTimerBase>_> *)
               in_stack_fffffffffffffed8);
    UniqueLock<GlobalMutex>::~UniqueLock
              ((UniqueLock<GlobalMutex> *)
               CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void RPCRunLater(const std::string& name, std::function<void()> func, int64_t nSeconds)
{
    if (!timerInterface)
        throw JSONRPCError(RPC_INTERNAL_ERROR, "No timer handler registered for RPC");
    LOCK(g_deadline_timers_mutex);
    deadlineTimers.erase(name);
    LogDebug(BCLog::RPC, "queue run of timer %s in %i seconds (using %s)\n", name, nSeconds, timerInterface->Name());
    deadlineTimers.emplace(name, std::unique_ptr<RPCTimerBase>(timerInterface->NewTimer(func, nSeconds*1000)));
}